

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

Locale * __thiscall icu_63::Locale::operator=(Locale *this,Locale *other)

{
  Locale *other_local;
  Locale *this_local;
  
  if (this->baseName != this->fullName) {
    uprv_free_63(this->baseName);
  }
  if (this->fullName != this->fullNameBuffer) {
    uprv_free_63(this->fullName);
  }
  if (other->fullName == other->fullNameBuffer) {
    strcpy(this->fullNameBuffer,other->fullNameBuffer);
    this->fullName = this->fullNameBuffer;
  }
  else {
    this->fullName = other->fullName;
  }
  if (other->baseName == other->fullName) {
    this->baseName = this->fullName;
  }
  else {
    this->baseName = other->baseName;
  }
  strcpy(this->language,other->language);
  strcpy(this->script,other->script);
  strcpy(this->country,other->country);
  this->variantBegin = other->variantBegin;
  this->fIsBogus = other->fIsBogus;
  other->fullName = other->fullNameBuffer;
  other->baseName = other->fullNameBuffer;
  return this;
}

Assistant:

Locale& Locale::operator=(Locale&& other) U_NOEXCEPT {
    if (baseName != fullName) uprv_free(baseName);
    if (fullName != fullNameBuffer) uprv_free(fullName);

    if (other.fullName == other.fullNameBuffer) {
        uprv_strcpy(fullNameBuffer, other.fullNameBuffer);
        fullName = fullNameBuffer;
    } else {
        fullName = other.fullName;
    }

    if (other.baseName == other.fullName) {
        baseName = fullName;
    } else {
        baseName = other.baseName;
    }

    uprv_strcpy(language, other.language);
    uprv_strcpy(script, other.script);
    uprv_strcpy(country, other.country);

    variantBegin = other.variantBegin;
    fIsBogus = other.fIsBogus;

    other.baseName = other.fullName = other.fullNameBuffer;

    return *this;
}